

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeckBuilder.cpp
# Opt level: O2

list<GreenCard_*,_std::allocator<GreenCard_*>_> * __thiscall
DeckBuilder::createFateDeck_abi_cxx11_(DeckBuilder *this)

{
  list<GreenCard_*,_std::allocator<GreenCard_*>_> *plVar1;
  Katana *pKVar2;
  Bow *this_00;
  Spear *this_01;
  Ninjato *this_02;
  Wakizashi *this_03;
  int iVar3;
  int iVar4;
  bool bVar5;
  allocator local_1a1;
  Katana *local_1a0;
  DeckBuilder *local_198;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar4 = 6;
  local_198 = this;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    plVar1 = local_198->green;
    pKVar2 = (Katana *)operator_new(0x158);
    std::__cxx11::string::string((string *)&local_50,"Peasants",&local_1a1);
    Footsoldier::Footsoldier((Footsoldier *)pKVar2,&local_50,3,1);
    local_1a0 = pKVar2;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  iVar4 = 6;
  iVar3 = 2;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    plVar1 = local_198->green;
    pKVar2 = (Katana *)operator_new(0x158);
    std::__cxx11::string::string((string *)&local_70,"Elite Troops",&local_1a1);
    Archer::Archer((Archer *)pKVar2,&local_70,3,2);
    local_1a0 = pKVar2;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_70);
  }
  iVar4 = 4;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    plVar1 = local_198->green;
    pKVar2 = (Katana *)operator_new(0x158);
    std::__cxx11::string::string((string *)&local_90,"Immortal Bushi",&local_1a1);
    Sieger::Sieger((Sieger *)pKVar2,&local_90,3,3);
    local_1a0 = pKVar2;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  iVar4 = 5;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    plVar1 = local_198->green;
    pKVar2 = (Katana *)operator_new(0x158);
    std::__cxx11::string::string((string *)&local_b0,"Unicorn Horses",&local_1a1);
    Cavalry::Cavalry((Cavalry *)pKVar2,&local_b0,3,4);
    local_1a0 = pKVar2;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  iVar4 = 5;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    plVar1 = local_198->green;
    pKVar2 = (Katana *)operator_new(0x158);
    std::__cxx11::string::string((string *)&local_d0,"Yomi Ships",&local_1a1);
    Atakebune::Atakebune((Atakebune *)pKVar2,&local_d0,3,5);
    local_1a0 = pKVar2;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    plVar1 = local_198->green;
    pKVar2 = (Katana *)operator_new(0x158);
    std::__cxx11::string::string((string *)&local_f0,"7 Samurai",&local_1a1);
    Bushido::Bushido((Bushido *)pKVar2,&local_f0,3,6);
    local_1a0 = pKVar2;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  iVar4 = 4;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    plVar1 = local_198->green;
    pKVar2 = (Katana *)operator_new(0x168);
    std::__cxx11::string::string((string *)&local_110,"Daijtso",&local_1a1);
    Katana::Katana(pKVar2,&local_110,4,1);
    local_1a0 = pKVar2;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  iVar4 = 2;
  iVar3 = 3;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    plVar1 = local_198->green;
    this_00 = (Bow *)operator_new(0x168);
    std::__cxx11::string::string((string *)&local_130,"Yumi",&local_1a1);
    Bow::Bow(this_00,&local_130,4,3);
    local_1a0 = (Katana *)this_00;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_130);
  }
  iVar4 = 2;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    plVar1 = local_198->green;
    this_01 = (Spear *)operator_new(0x168);
    std::__cxx11::string::string((string *)&local_150,"Kama",&local_1a1);
    Spear::Spear(this_01,&local_150,4,2);
    local_1a0 = (Katana *)this_01;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_150);
  }
  while( true ) {
    plVar1 = local_198->green;
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) break;
    this_02 = (Ninjato *)operator_new(0x168);
    std::__cxx11::string::string((string *)&local_170,"Butterfly Dagger",&local_1a1);
    Ninjato::Ninjato(this_02,&local_170,4,4);
    local_1a0 = (Katana *)this_02;
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
              (plVar1,(value_type *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_170);
  }
  this_03 = (Wakizashi *)operator_new(0x168);
  std::__cxx11::string::string((string *)&local_190,"Kusanagi",&local_1a1);
  Wakizashi::Wakizashi(this_03,&local_190,4,5);
  local_1a0 = (Katana *)this_03;
  std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::push_back
            (plVar1,(value_type *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_190);
  return local_198->green;
}

Assistant:

list<GreenCard *> *DeckBuilder::createFateDeck()
{
    //enum Type{PERSONALITY = 1, HOLDING, FOLLOWER, ITEM};
    //added 2 ints in constructors
    //first int corresponds to Card::Type enum
    //second to Card::Followers, Items, Personalities or Holdings

	int i;
	for (i = 0; i < NO_FOOTSOLDIER; i++)
		green->push_back(new Footsoldier{"Peasants", 3, 1});
	for (i = 0; i < NO_ARCHER; i++)
		green->push_back(new Archer{"Elite Troops", 3, 2});
	for (i = 0; i < NO_SIEGER; i++)
		green->push_back(new Sieger{"Immortal Bushi", 3, 3});
	for (i = 0; i < NO_CAVALRY; i++)
		green->push_back(new Cavalry{"Unicorn Horses", 3, 4});
	for (i = 0; i < NO_NAVAL; i++)
		green->push_back(new Atakebune{"Yomi Ships", 3, 5});
	for (i = 0; i < NO_BUSHIDO; i++)
		green->push_back(new Bushido{"7 Samurai", 3, 6});

	for (i = 0; i < NO_KATANA; i++)
		green->push_back(new Katana{"Daijtso", 4, 1});
	for (i = 0; i < NO_BOW; i++)
		green->push_back(new Bow{"Yumi", 4, 3});
	for (i = 0; i < NO_SPEAR; i++)
		green->push_back(new Spear{"Kama", 4, 2});
	for (i = 0; i < NO_NINJATO; i++)
		green->push_back(new Ninjato{"Butterfly Dagger", 4, 4});
	for (i = 0; i < NO_WAKIZASHI; i++)
		green->push_back(new Wakizashi{"Kusanagi", 4, 5});

	return green;
}